

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Psbt::GetPsbtVersion(Psbt *this)

{
  CfdException *this_00;
  undefined1 local_40 [32];
  
  if (this->wally_psbt_pointer_ != (void *)0x0) {
    return *(uint32_t *)((long)this->wally_psbt_pointer_ + 0x58);
  }
  local_40._0_8_ = "cfdcore_psbt.cpp";
  local_40._8_4_ = 0xc50;
  local_40._16_8_ = "GetPsbtVersion";
  logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"psbt pointer is null");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"psbt pointer is null.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Psbt::GetPsbtVersion() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }
  return psbt_pointer->version;
}